

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_core.c
# Opt level: O1

void grasshopper_decrypt_block
               (grasshopper_round_keys_t *subkeys,grasshopper_w128_t *source,
               grasshopper_w128_t *target,grasshopper_w128_t *buffer)

{
  byte bVar1;
  bool bVar2;
  int i;
  long lVar3;
  grasshopper_w128_t (*pagVar4) [256];
  grasshopper_w128_t *pgVar5;
  ulong uVar6;
  int i_2;
  long lVar7;
  
  lVar3 = 0;
  do {
    target->q[lVar3] = source->q[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  buffer->q[0] = 0;
  buffer->q[1] = 0;
  pagVar4 = grasshopper_l_dec128;
  lVar3 = 0;
  do {
    bVar1 = target->b[lVar3];
    lVar7 = 0;
    do {
      buffer->q[lVar7] =
           buffer->q[lVar7] ^ *(ulong *)((long)*pagVar4 + lVar7 * 8 + (ulong)bVar1 * 0x10);
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
    lVar3 = lVar3 + 1;
    pagVar4 = pagVar4 + 1;
  } while (lVar3 != 0x10);
  lVar3 = 0;
  do {
    target->q[lVar3] = buffer->q[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  pgVar5 = subkeys->k + 9;
  uVar6 = 9;
  do {
    lVar3 = 0;
    do {
      target->q[lVar3] = target->q[lVar3] ^ pgVar5->q[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    buffer->q[0] = 0;
    buffer->q[1] = 0;
    pagVar4 = grasshopper_pil_dec128;
    lVar3 = 0;
    do {
      bVar1 = target->b[lVar3];
      lVar7 = 0;
      do {
        buffer->q[lVar7] =
             buffer->q[lVar7] ^ *(ulong *)((long)*pagVar4 + lVar7 * 8 + (ulong)bVar1 * 0x10);
        lVar7 = lVar7 + 1;
      } while (lVar7 == 1);
      lVar3 = lVar3 + 1;
      pagVar4 = pagVar4 + 1;
    } while (lVar3 != 0x10);
    lVar3 = 0;
    do {
      target->q[lVar3] = buffer->q[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    pgVar5 = pgVar5 + -1;
    bVar2 = 2 < uVar6;
    uVar6 = uVar6 - 1;
  } while (bVar2);
  lVar3 = 0;
  do {
    target->q[lVar3] = target->q[lVar3] ^ *(ulong *)((long)subkeys->k + lVar3 * 8 + 0x10);
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  lVar3 = 0;
  do {
    target->b[lVar3] = grasshopper_pi_inv[target->b[lVar3]];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  lVar3 = 0;
  do {
    target->q[lVar3] = target->q[lVar3] ^ subkeys->k[0].q[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  return;
}

Assistant:

void grasshopper_decrypt_block(grasshopper_round_keys_t* subkeys, grasshopper_w128_t* source,
                               grasshopper_w128_t* target, grasshopper_w128_t* buffer) {
    int i;
    grasshopper_copy128(target, source);

    grasshopper_append128multi(buffer, target, grasshopper_l_dec128);

    for (i = 9; i > 1; i--) {
        grasshopper_append128(target, &subkeys->k[i]);
        grasshopper_append128multi(buffer, target, grasshopper_pil_dec128);
    }

    grasshopper_append128(target, &subkeys->k[1]);
    grasshopper_convert128(target, grasshopper_pi_inv);
    grasshopper_append128(target, &subkeys->k[0]);
}